

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_164db4ee comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  pdqsort_detail *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  HighsSymmetryDetection *pHVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  bool bVar7;
  HighsInt HVar8;
  HighsInt HVar9;
  long lVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  HighsSymmetryDetection *pHVar12;
  ulong uVar13;
  ulong uVar14;
  HighsSymmetryDetection *pHVar15;
  uint uVar16;
  int *piVar17;
  undefined4 in_register_0000008c;
  HighsSymmetryDetection *pHVar19;
  ulong uVar20;
  long lVar21;
  int *piVar22;
  HighsSymmetryDetection *pHVar23;
  int *piVar24;
  anon_class_16_2_164db4ee comp_00;
  anon_class_16_2_164db4ee comp_01;
  anon_class_16_2_164db4ee comp_02;
  anon_class_16_2_164db4ee comp_03;
  anon_class_16_2_164db4ee comp_04;
  anon_class_16_2_164db4ee comp_05;
  anon_class_16_2_164db4ee comp_06;
  anon_class_16_2_164db4ee comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HighsSymmetry_cpp:1432:46)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HighsSymmetry_cpp:1432:46)>
  __comp_00;
  _DistanceType __len;
  undefined1 in_stack_ffffffffffffff58;
  long local_90;
  HighsSymmetryDetection *local_68;
  HighsSymmetryDetection *pHVar18;
  
  pHVar19 = (HighsSymmetryDetection *)CONCAT44(in_register_0000008c,bad_allowed);
  local_68 = comp.this;
  comp_00.componentData = (HighsSymmetryDetection *)comp.componentData;
  b._M_current = begin._M_current + -1;
LAB_00304dc4:
  lVar10 = (long)begin._M_current - (long)this;
  uVar13 = lVar10 >> 2;
  if (0x17 < (long)uVar13) {
    uVar20 = uVar13 >> 1;
    _Var11._M_current = (int *)((long)this + uVar20 * 4);
    if ((long)uVar13 < 0x81) {
      comp_07.this = pHVar19;
      comp_07.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)_Var11._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,b,end,
                 comp_07);
    }
    else {
      comp_03.this = pHVar19;
      comp_03.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                (this,_Var11,b,end,comp_03);
      comp_04.this = pHVar19;
      comp_04.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + 4),(int *)((long)this + (uVar20 - 1) * 4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -2),end,comp_04);
      piVar17 = (int *)((long)this + uVar20 * 4);
      comp_05.this = pHVar19;
      comp_05.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + 8),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar17 + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + -3),end,comp_05);
      comp_06.this = pHVar19;
      comp_06.componentData = (ComponentData *)comp_00.componentData;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                ((pdqsort_detail *)((long)this + (uVar20 - 1) * 4),_Var11,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar17 + 1),
                 end,comp_06);
      iVar1 = *(int *)this;
      *(int *)this = *piVar17;
      *piVar17 = iVar1;
    }
    if ((bad_allowed & 1U) == 0) {
      iVar1 = *(int *)this;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)((long)this + -4)]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if ((iVar1 == 1) || (iVar2 != 1)) {
        if ((HVar9 <= HVar8) || (iVar1 == 1 && iVar2 != 1)) {
          iVar1 = *(int *)this;
          lVar10 = 0;
          do {
            iVar2 = *(b._M_current + lVar10);
            HVar8 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar9 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
            if ((iVar2 == 1) || (iVar3 != 1)) {
              if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) goto LAB_003053c6;
            }
            lVar10 = lVar10 + -4;
          } while( true );
        }
      }
    }
    iVar1 = *(int *)this;
    lVar21 = 0;
    _Var11._M_current = (int *)this;
    do {
      pHVar12 = (HighsSymmetryDetection *)
                ((long)&((HighsSymmetryDetection *)_Var11._M_current)->model + 4);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)&pHVar12->model]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if ((iVar2 == 1) || (iVar3 != 1)) {
        if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) goto LAB_00305247;
      }
      lVar21 = lVar21 + -4;
      _Var11._M_current = (int *)pHVar12;
    } while( true );
  }
  piVar17 = (int *)((long)this + 4);
  bVar6 = true;
  if ((bad_allowed & 1U) != 0) {
    if (piVar17 == begin._M_current || this == (pdqsort_detail *)begin._M_current)
    goto LAB_00305800;
    local_90 = 0;
    _Var11._M_current = (int *)this;
    do {
      iVar1 = *_Var11._M_current;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar17]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar1 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if ((iVar1 == 1) || (iVar2 != 1)) {
        if ((HVar8 < HVar9) && (iVar1 != 1 || iVar2 == 1)) goto LAB_00304e80;
      }
      else {
LAB_00304e80:
        iVar1 = *piVar17;
        piVar22 = piVar17 + -1;
        *piVar17 = *_Var11._M_current;
        if ((pdqsort_detail *)piVar22 != this) {
          lVar10 = 0;
          do {
            iVar2 = *(_Var11._M_current + lVar10 + -4);
            HVar8 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar9 = HighsDisjointSets<false>::getSet
                              ((HighsDisjointSets<false> *)end._M_current,
                               ((comp_00.componentData)->vertexPosition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
            iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
            if ((iVar2 == 1) || (iVar3 != 1)) {
              if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) break;
            }
            *(undefined4 *)((long)_Var11._M_current + lVar10) =
                 *(undefined4 *)((long)_Var11._M_current + lVar10 + -4);
            lVar10 = lVar10 + -4;
          } while (local_90 != lVar10);
          piVar22 = lVar10 + _Var11._M_current;
        }
        *piVar22 = iVar1;
      }
      piVar17 = piVar17 + 1;
      _Var11._M_current = _Var11._M_current + 1;
      local_90 = local_90 + -4;
    } while (piVar17 != begin._M_current);
    goto LAB_003057fa;
  }
  _Var11._M_current = (int *)this;
  if (piVar17 != begin._M_current && this != (pdqsort_detail *)begin._M_current) {
LAB_0030501c:
    iVar1 = *_Var11._M_current;
    HVar8 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[_Var11._M_current[1]]);
    HVar9 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar1]);
    iVar1 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
    iVar2 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
    if ((iVar1 != 1) && (iVar2 == 1)) {
LAB_00305088:
      iVar1 = *piVar17;
LAB_00305096:
      do {
        piVar22 = _Var11._M_current;
        piVar22[1] = *piVar22;
        iVar2 = piVar22[-1];
        HVar8 = HighsDisjointSets<false>::getSet
                          ((HighsDisjointSets<false> *)end._M_current,
                           ((comp_00.componentData)->vertexPosition).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar1]);
        HVar9 = HighsDisjointSets<false>::getSet
                          ((HighsDisjointSets<false> *)end._M_current,
                           ((comp_00.componentData)->vertexPosition).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2]);
        iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
        iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
        _Var11._M_current = piVar22 + -1;
        if (iVar2 != 1) {
          if (iVar3 == 1) goto LAB_00305096;
        }
        if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) goto LAB_0030510a;
      } while( true );
    }
    if ((HVar8 < HVar9) && (iVar1 != 1 || iVar2 == 1)) goto LAB_00305088;
    goto LAB_0030511c;
  }
  goto LAB_00305800;
LAB_003053c6:
  piVar17 = b._M_current + lVar10;
  if (lVar10 == 0) {
    piVar22 = (int *)((long)this + 4);
    do {
      piVar24 = piVar22 + -1;
      if (piVar17 <= piVar22 + -1) break;
      iVar2 = *piVar22;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      piVar24 = piVar22;
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      piVar22 = piVar22 + 1;
    } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  }
  else {
    piVar22 = (int *)((long)this + 4);
    do {
      piVar24 = piVar22;
      iVar2 = *piVar24;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      piVar22 = piVar24 + 1;
    } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  }
  if (piVar24 < piVar17) {
LAB_003058b1:
    iVar2 = *piVar24;
    *piVar24 = *piVar17;
    *piVar17 = iVar2;
LAB_003058c4:
    do {
      piVar17 = piVar17 + -1;
      iVar2 = *piVar17;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if (iVar2 != 1) {
        if (iVar3 == 1) goto LAB_003058c4;
      }
      if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) goto LAB_0030592a;
    } while( true );
  }
LAB_003059af:
  *(int *)this = *piVar17;
  *piVar17 = iVar1;
  this = (pdqsort_detail *)(piVar17 + 1);
  bVar6 = false;
  goto LAB_00305800;
LAB_0030592a:
  piVar22 = piVar24 + 1;
  do {
    piVar24 = piVar22;
    iVar2 = *piVar24;
    HVar8 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar1]);
    HVar9 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar2]);
    iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
    iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
    if ((iVar2 != 1) && (iVar3 == 1)) break;
    piVar22 = piVar24 + 1;
  } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  if (piVar17 <= piVar24) goto LAB_003059af;
  goto LAB_003058b1;
LAB_00305247:
  _Var5._M_current = b._M_current;
  if (lVar21 == 0) {
    do {
      pHVar15 = (HighsSymmetryDetection *)_Var5._M_current;
      pHVar18 = (HighsSymmetryDetection *)((long)&pHVar15->model + 4);
      if (pHVar18 <= pHVar12) break;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)&pHVar15->model]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      pHVar18 = pHVar15;
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      _Var5._M_current =
           (int *)((long)&pHVar15[-1].nodeStack.
                          super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  }
  else {
    do {
      pHVar18 = (HighsSymmetryDetection *)_Var5._M_current;
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)&pHVar18->model]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if ((iVar2 != 1) && (iVar3 == 1)) break;
      _Var5._M_current =
           (int *)((long)&pHVar18[-1].nodeStack.
                          super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  }
  pHVar15 = pHVar18;
  pHVar23 = pHVar12;
  if (pHVar12 < pHVar18) {
LAB_00305478:
    iVar2 = *(int *)&pHVar23->model;
    *(int *)&pHVar23->model = *(int *)&pHVar15->model;
    *(int *)&pHVar15->model = iVar2;
LAB_00305484:
    do {
      _Var11._M_current = (int *)pHVar23;
      pHVar23 = (HighsSymmetryDetection *)
                ((long)&((HighsSymmetryDetection *)_Var11._M_current)->model + 4);
      HVar8 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)&pHVar23->model]);
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end._M_current,
                         ((comp_00.componentData)->vertexPosition).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
      iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
      iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
      if (iVar2 != 1) {
        if (iVar3 == 1) goto LAB_00305484;
      }
      if ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1)) goto LAB_003054e1;
    } while( true );
  }
LAB_00305574:
  *(int *)this = *_Var11._M_current;
  *_Var11._M_current = iVar1;
  uVar14 = (long)_Var11._M_current - (long)this >> 2;
  this_00 = (pdqsort_detail *)(_Var11._M_current + 1);
  uVar20 = (long)begin._M_current - (long)this_00 >> 2;
  if (((long)uVar14 < (long)(uVar13 >> 3)) || ((long)uVar20 < (long)(uVar13 >> 3))) {
    uVar16 = (int)local_68 - 1;
    local_68 = (HighsSymmetryDetection *)(ulong)uVar16;
    if (uVar16 == 0) {
      lVar21 = (long)((uVar13 - ((long)(uVar13 - 2) >> 0x3f)) + -2) >> 1;
      do {
        __comp._M_comp.this = comp_00.componentData;
        __comp._M_comp.componentData = (ComponentData *)end._M_current;
        pHVar19 = comp_00.componentData;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,lVar21,
                   uVar13,*(int *)((long)this + lVar21 * 4),__comp);
        bVar6 = lVar21 != 0;
        lVar21 = lVar21 + -1;
      } while (bVar6);
      bVar6 = true;
      _Var11._M_current = b._M_current;
      if (lVar10 < 5) {
        local_68 = (HighsSymmetryDetection *)0x0;
      }
      else {
        do {
          iVar1 = *_Var11._M_current;
          *_Var11._M_current = *(int *)this;
          lVar10 = lVar10 + -4;
          __comp_00._M_comp.this = comp_00.componentData;
          __comp_00._M_comp.componentData = (ComponentData *)end._M_current;
          pHVar19 = comp_00.componentData;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,0,
                     lVar10 >> 2,iVar1,__comp_00);
          _Var11._M_current = _Var11._M_current + -1;
        } while (4 < lVar10);
        local_68 = (HighsSymmetryDetection *)0x0;
LAB_003057fa:
        bVar6 = true;
      }
      goto LAB_00305800;
    }
    if (0x17 < (long)uVar14) {
      uVar13 = uVar14 & 0xfffffffffffffffc;
      iVar1 = *(int *)this;
      *(int *)this = *(int *)((long)this + uVar13);
      *(int *)((long)this + uVar13) = iVar1;
      iVar1 = _Var11._M_current[-1];
      _Var11._M_current[-1] = *(_Var11._M_current - uVar13);
      *(_Var11._M_current - uVar13) = iVar1;
      if (0x80 < (long)uVar14) {
        uVar14 = uVar14 >> 2;
        iVar1 = *(int *)((long)this + 4);
        *(int *)((long)this + 4) = *(int *)((long)this + (uVar14 + 1) * 4);
        *(int *)((long)this + (uVar14 + 1) * 4) = iVar1;
        iVar1 = *(int *)((long)this + 8);
        *(int *)((long)this + 8) = *(int *)((long)this + (uVar14 + 2) * 4);
        *(int *)((long)this + (uVar14 + 2) * 4) = iVar1;
        iVar1 = _Var11._M_current[-2];
        _Var11._M_current[-2] = _Var11._M_current[~uVar14];
        _Var11._M_current[~uVar14] = iVar1;
        iVar1 = _Var11._M_current[-3];
        _Var11._M_current[-3] = _Var11._M_current[-2 - uVar14];
        _Var11._M_current[-2 - uVar14] = iVar1;
      }
    }
    if (0x17 < (long)uVar20) {
      iVar1 = _Var11._M_current[1];
      uVar13 = uVar20 & 0xfffffffffffffffc;
      _Var11._M_current[1] = *(uVar13 + 4 + _Var11._M_current);
      *(uVar13 + 4 + _Var11._M_current) = iVar1;
      iVar1 = begin._M_current[-1];
      begin._M_current[-1] = *(begin._M_current - uVar13);
      *(begin._M_current - uVar13) = iVar1;
      if (0x80 < (long)uVar20) {
        uVar20 = uVar20 >> 2;
        iVar1 = _Var11._M_current[2];
        _Var11._M_current[2] = _Var11._M_current[uVar20 + 2];
        _Var11._M_current[uVar20 + 2] = iVar1;
        iVar1 = _Var11._M_current[3];
        _Var11._M_current[3] = _Var11._M_current[uVar20 + 3];
        _Var11._M_current[uVar20 + 3] = iVar1;
        iVar1 = begin._M_current[-2];
        begin._M_current[-2] = begin._M_current[~uVar20];
        begin._M_current[~uVar20] = iVar1;
        iVar1 = begin._M_current[-3];
        begin._M_current[-3] = begin._M_current[-2 - uVar20];
        begin._M_current[-2 - uVar20] = iVar1;
      }
    }
  }
  else if ((pHVar18 <= pHVar12) &&
          (comp_00.this = pHVar18,
          bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                            (this,_Var11,end,comp_00), bVar6)) {
    comp_01.this = pHVar18;
    comp_01.componentData = (ComponentData *)comp_00.componentData;
    bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
                      (this_00,begin,end,comp_01);
    bVar6 = true;
    if (bVar7) goto LAB_00305800;
  }
  pHVar19 = (HighsSymmetryDetection *)(ulong)(bad_allowed & 1U);
  comp_02.this = local_68;
  comp_02.componentData = (ComponentData *)comp_00.componentData;
  pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
            (this,_Var11,end,comp_02,bad_allowed & 1U,(bool)in_stack_ffffffffffffff58);
  bVar6 = false;
  bad_allowed = 0;
  this = this_00;
LAB_00305800:
  if (bVar6) {
    return;
  }
  goto LAB_00304dc4;
LAB_003054e1:
  pHVar4 = (HighsSymmetryDetection *)
           ((long)&pHVar15[-1].nodeStack.
                   super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  do {
    pHVar15 = pHVar4;
    HVar8 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[*(int *)&pHVar15->model]);
    HVar9 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)end._M_current,
                       ((comp_00.componentData)->vertexPosition).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[iVar1]);
    iVar2 = *(int *)(*(long *)end._M_current + (long)HVar8 * 4);
    iVar3 = *(int *)(*(long *)end._M_current + (long)HVar9 * 4);
    if ((iVar2 != 1) && (iVar3 == 1)) break;
    pHVar4 = (HighsSymmetryDetection *)
             ((long)&pHVar15[-1].nodeStack.
                     super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  } while ((HVar9 <= HVar8) || (iVar2 == 1 && iVar3 != 1));
  if (pHVar15 <= pHVar23) goto LAB_00305574;
  goto LAB_00305478;
LAB_0030510a:
  *piVar22 = iVar1;
LAB_0030511c:
  piVar22 = piVar17 + 1;
  _Var11._M_current = piVar17;
  piVar17 = piVar22;
  if (piVar22 == begin._M_current) goto LAB_003057fa;
  goto LAB_0030501c;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }